

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_225155::OSScapture::~OSScapture(OSScapture *this)

{
  OSScapture *in_RDI;
  
  ~OSScapture(in_RDI);
  (anonymous_namespace)::OSScapture::operator_delete((void *)0x23a7d2);
  return;
}

Assistant:

OSScapture::~OSScapture()
{
    if(mFd != -1)
        close(mFd);
    mFd = -1;
}